

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

uint dasm_read_imm_8(uint advance)

{
  uint local_10;
  uint result;
  uint advance_local;
  
  if (g_rawop == (uchar *)0x0) {
    local_10 = m68k_read_disassembler_16(g_cpu_pc & g_address_mask);
    local_10 = local_10 & 0xff;
  }
  else {
    local_10 = (uint)g_rawop[(g_cpu_pc + 1) - g_rawbasepc];
  }
  g_cpu_pc = advance + g_cpu_pc;
  return local_10;
}

Assistant:

static uint dasm_read_imm_8(uint advance)
{
	uint result;
	if (g_rawop)
		result = g_rawop[g_cpu_pc + 1 - g_rawbasepc];
	else
		result = m68k_read_disassembler_16(g_cpu_pc & g_address_mask) & 0xff;
	g_cpu_pc += advance;
	return result;
}